

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

ostream * ccd::Json::operator<<(ostream *os,Value *val)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  Object *obj;
  Array *array;
  char *pcVar6;
  double dVar7;
  Value *val_local;
  ostream *os_local;
  
  TVar2 = Value::type(val);
  switch(TVar2) {
  case Int:
    iVar3 = Value::operator_cast_to_int(val);
    std::ostream::operator<<(os,iVar3);
    break;
  case Double:
    dVar7 = Value::operator_cast_to_double(val);
    std::ostream::operator<<(os,dVar7);
    break;
  case Bool:
    bVar1 = Value::operator_cast_to_bool(val);
    pcVar6 = "false";
    if (bVar1) {
      pcVar6 = "true";
    }
    std::operator<<(os,pcVar6);
    break;
  case String:
    poVar4 = std::operator<<(os,"\"");
    psVar5 = Value::operator_cast_to_string_(val);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    std::operator<<(poVar4,"\"");
    break;
  case Object:
    obj = Value::operator_cast_to_map_(val);
    operator<<(os,obj);
    break;
  case Array:
    array = Value::operator_cast_to_vector_(val);
    operator<<(os,array);
    break;
  case Null:
    std::operator<<(os,"null");
  }
  return os;
}

Assistant:

std::ostream & operator<< ( std::ostream & os, const Value& val )
{
	switch ( val.type() ) {
	case Value::Type::Int:
		os << static_cast<int>(val);
		break;
	case Value::Type::Double:
		os << static_cast<double>(val);
		break;
	case Value::Type::Bool:
		os << ( static_cast<bool>(val)?"true":"false" );
		break;
	case Value::Type::String:
		os << "\"" << static_cast<const std::string&>(val) << "\"";
		break;
	case Value::Type::Object:
		os << static_cast<const Object&>(val);
		break;
	case Value::Type::Array:
		os << static_cast<const Array&>(val);
		break;
	case Value::Type::Null:
		os << "null";
		break;
	default:
		break;
	}
	return os;
}